

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O2

bool duckdb::Transformer::TransformPivotInList
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *expr,PivotColumnEntry *entry,bool root_entry)

{
  ExpressionType EVar1;
  pointer puVar2;
  optional_idx error_location;
  bool bVar3;
  bool bVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  ColumnRefExpression *this;
  string *__args;
  FunctionExpression *pFVar7;
  type expr_00;
  ParserException *this_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  pointer expr_01;
  allocator local_79;
  LogicalType local_78;
  Value val;
  
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar5->super_BaseExpression).type;
  if (EVar1 == FUNCTION) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    pFVar7 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar6);
    bVar3 = ::std::operator!=(&pFVar7->function_name,"row");
    if (bVar3) {
      bVar3 = false;
    }
    else {
      expr_01 = (pFVar7->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pFVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar3 = expr_01 == puVar2;
        if (bVar3) {
          return bVar3;
        }
        bVar4 = TransformPivotInList(expr_01,entry,false);
        expr_01 = expr_01 + 1;
      } while (bVar4);
    }
  }
  else if (EVar1 == COLUMN_REF) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
    bVar3 = ColumnRefExpression::IsQualified(this);
    if (bVar3) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expr);
      error_location.index = (pPVar5->super_BaseExpression).query_location.index;
      ::std::__cxx11::string::string
                ((string *)&val,"PIVOT IN list cannot contain qualified column references",&local_79
                );
      ParserException::ParserException<>(this_00,error_location,(string *)&val);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    __args = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)entry,__args);
    bVar3 = true;
  }
  else {
    LogicalType::LogicalType(&local_78,SQLNULL);
    Value::Value(&val,&local_78);
    LogicalType::~LogicalType(&local_78);
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    bVar3 = ConstructConstantFromExpression(expr_00,&val);
    if (bVar3) {
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)entry,&val);
    }
    Value::~Value(&val);
  }
  return bVar3;
}

Assistant:

bool Transformer::TransformPivotInList(unique_ptr<ParsedExpression> &expr, PivotColumnEntry &entry, bool root_entry) {
	switch (expr->GetExpressionType()) {
	case ExpressionType::COLUMN_REF: {
		auto &colref = expr->Cast<ColumnRefExpression>();
		if (colref.IsQualified()) {
			throw ParserException(expr->GetQueryLocation(), "PIVOT IN list cannot contain qualified column references");
		}
		entry.values.emplace_back(colref.GetColumnName());
		return true;
	}
	case ExpressionType::FUNCTION: {
		auto &function = expr->Cast<FunctionExpression>();
		if (function.function_name != "row") {
			return false;
		}
		for (auto &child : function.children) {
			if (!TransformPivotInList(child, entry, false)) {
				return false;
			}
		}
		return true;
	}
	default: {
		Value val;
		if (!Transformer::ConstructConstantFromExpression(*expr, val)) {
			return false;
		}
		entry.values.push_back(std::move(val));
		return true;
	}
	}
}